

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O0

void Gia_ManCorrPerformRemapping(Vec_Int_t *vPairs,Vec_Ptr_t *vInfo)

{
  int iVar1;
  int iVar2;
  int i_00;
  void *pvVar3;
  void *pvVar4;
  int nWords;
  int iRepr;
  int iObj;
  int i;
  int w;
  uint *pInfoRepr;
  uint *pInfoObj;
  Vec_Ptr_t *vInfo_local;
  Vec_Int_t *vPairs_local;
  
  iVar1 = Vec_PtrReadWordsSimInfo(vInfo);
  iRepr = 0;
  do {
    iVar2 = Vec_IntSize(vPairs);
    if (iVar2 <= iRepr) {
      return;
    }
    iVar2 = Vec_IntEntry(vPairs,iRepr);
    i_00 = Vec_IntEntry(vPairs,iRepr + 1);
    pvVar3 = Vec_PtrEntry(vInfo,i_00);
    pvVar4 = Vec_PtrEntry(vInfo,iVar2);
    for (iObj = 0; iObj < iVar1; iObj = iObj + 1) {
      if (*(int *)((long)pvVar3 + (long)iObj * 4) != 0) {
        __assert_fail("pInfoObj[w] == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                      ,0x197,"void Gia_ManCorrPerformRemapping(Vec_Int_t *, Vec_Ptr_t *)");
      }
      *(undefined4 *)((long)pvVar3 + (long)iObj * 4) =
           *(undefined4 *)((long)pvVar4 + (long)iObj * 4);
    }
    iRepr = iRepr + 2;
  } while( true );
}

Assistant:

void Gia_ManCorrPerformRemapping( Vec_Int_t * vPairs, Vec_Ptr_t * vInfo )
{
    unsigned * pInfoObj, * pInfoRepr;
    int w, i, iObj, iRepr, nWords;
    nWords = Vec_PtrReadWordsSimInfo( vInfo );
    Vec_IntForEachEntry( vPairs, iRepr, i )
    {
        iObj = Vec_IntEntry( vPairs, ++i );
        pInfoObj = (unsigned *)Vec_PtrEntry( vInfo, iObj );
        pInfoRepr = (unsigned *)Vec_PtrEntry( vInfo, iRepr );
        for ( w = 0; w < nWords; w++ )
        {
            assert( pInfoObj[w] == 0 );
            pInfoObj[w] = pInfoRepr[w];
        }
    }
}